

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expreplay.h
# Opt level: O2

void ExpReplay::end_pass(expreplay *er)

{
  long lVar1;
  size_t n;
  ulong uVar2;
  
  lVar1 = 0;
  for (uVar2 = 0; uVar2 < er->N; uVar2 = uVar2 + 1) {
    if (er->filled[uVar2] == true) {
      LEARNER::learner<char,_example>::learn
                (er->base,(example *)
                          ((long)(er->buf->super_example_predict).feature_space + lVar1 + -0x20),0);
      er->filled[uVar2] = false;
    }
    lVar1 = lVar1 + 0x68d0;
  }
  return;
}

Assistant:

void end_pass(expreplay& er)
{  // we need to go through and learn on everyone who remains
  // also need to clean up remaining examples
  for (size_t n = 0; n < er.N; n++)
    if (er.filled[n])
    {  // TODO: if er.replay_count > 1 do we need to play these more?
      er.base->learn(er.buf[n]);
      er.filled[n] = false;
    }
}